

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O2

FT_Error TT_Load_Simple_Glyph(TT_Loader load)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  FT_GlyphLoader loader;
  FT_GlyphSlot pFVar5;
  TT_ExecContext pTVar6;
  FT_Byte *__dest;
  bool bVar7;
  ushort uVar8;
  FT_Error FVar9;
  ushort *puVar10;
  ushort *puVar11;
  ulong uVar12;
  ushort *puVar13;
  ulong uVar14;
  byte *pbVar15;
  FT_Vector *pFVar16;
  FT_Vector *pFVar17;
  byte *pbVar18;
  ushort uVar19;
  char cVar20;
  long lVar21;
  FT_UInt n_contours;
  byte *pbVar22;
  byte *pbVar23;
  ulong local_50;
  FT_ULong tmp;
  ulong local_40;
  ushort local_32;
  
  loader = load->gloader;
  pbVar18 = load->cursor;
  tmp = (FT_ULong)load->limit;
  sVar4 = load->n_contours;
  n_contours = (FT_UInt)sVar4;
  if (sVar4 == 0) {
    puVar10 = (ushort *)(loader->current).outline.contours;
    puVar13 = puVar10;
  }
  else {
    if ((loader->max_contours <
         (int)(loader->base).outline.n_contours + n_contours +
         (int)(loader->current).outline.n_contours) &&
       (FVar9 = FT_GlyphLoader_CheckPoints(loader,0,n_contours), FVar9 != 0)) {
      return FVar9;
    }
    if (0xffe < sVar4) {
      return 0x14;
    }
    puVar10 = (ushort *)(loader->current).outline.contours;
    puVar13 = puVar10 + (int)n_contours;
  }
  if (tmp < pbVar18 + (long)(int)n_contours * 2 + 2) {
    return 0x14;
  }
  bVar2 = *pbVar18;
  uVar8 = CONCAT11(bVar2,pbVar18[1]);
  if (0 < sVar4) {
    *puVar10 = uVar8;
  }
  if ((short)((ushort)bVar2 << 8) < 0) {
    return 0x14;
  }
  pbVar22 = pbVar18 + 4;
  pbVar18 = (byte *)(tmp + (-4 - (long)pbVar18));
  while (puVar11 = puVar10 + 1, puVar11 < puVar13) {
    uVar19 = *(ushort *)(pbVar22 + -2) << 8 | *(ushort *)(pbVar22 + -2) >> 8;
    *puVar11 = uVar19;
    pbVar22 = pbVar22 + 2;
    pbVar18 = pbVar18 + -2;
    bVar7 = (short)uVar19 <= (short)uVar8;
    puVar10 = puVar11;
    uVar8 = uVar19;
    if (bVar7) {
      return 0x14;
    }
  }
  if (sVar4 < 1) {
    local_40 = 0;
  }
  else {
    if ((short)*puVar10 < -1) {
      return 0x14;
    }
    local_40 = (ulong)((int)(short)*puVar10 + 1);
  }
  pbVar23 = (byte *)tmp;
  if ((loader->max_points <
       (uint)((int)(loader->base).outline.n_points + (int)local_40 + 4 +
             (int)(loader->current).outline.n_points)) &&
     (FVar9 = FT_GlyphLoader_CheckPoints(loader,(int)local_40 + 4,0), pbVar23 = (byte *)tmp,
     FVar9 != 0)) {
    return FVar9;
  }
  pFVar5 = load->glyph;
  pFVar5->control_data = (void *)0x0;
  pFVar5->control_len = 0;
  if (pbVar23 < pbVar22) {
    return 0x14;
  }
  local_32 = *(ushort *)(pbVar22 + -2) << 8 | *(ushort *)(pbVar22 + -2) >> 8;
  uVar14 = (ulong)local_32;
  tmp = (FT_ULong)loader;
  if ((load->load_flags & 2) == 0) {
    if ((long)pbVar18 < (long)uVar14) {
      return 0x16;
    }
    pTVar6 = load->exec;
    local_50 = (ulong)pTVar6->glyphSize;
    FVar9 = Update_Max(pTVar6->memory,&local_50,1,&pTVar6->glyphIns,uVar14);
    pTVar6 = load->exec;
    pTVar6->glyphSize = (uint)(ushort)local_50;
    if (FVar9 != 0) {
      return FVar9;
    }
    pFVar5 = load->glyph;
    pFVar5->control_len = uVar14;
    __dest = pTVar6->glyphIns;
    pFVar5->control_data = __dest;
    if (local_32 != 0) {
      memcpy(__dest,pbVar22,uVar14);
    }
  }
  pbVar15 = (byte *)(((FT_GlyphLoader)tmp)->current).outline.tags;
  uVar12 = local_40 & 0xffffffff;
  pbVar1 = pbVar15 + uVar12;
  pbVar18 = pbVar22 + uVar14;
  while (pbVar22 = pbVar18, pbVar15 < pbVar1) {
    pbVar18 = pbVar22 + 1;
    if (pbVar23 < pbVar18) goto LAB_00229449;
    bVar2 = *pbVar22;
    *pbVar15 = bVar2;
    pbVar15 = pbVar15 + 1;
    if ((bVar2 & 8) != 0) {
      if ((pbVar23 < pbVar22 + 2) || (uVar14 = (ulong)*pbVar18, pbVar1 < pbVar15 + uVar14))
      goto LAB_00229449;
      while (cVar20 = (char)uVar14, uVar14 = (ulong)(byte)(cVar20 - 1), pbVar18 = pbVar22 + 2,
            cVar20 != '\0') {
        *pbVar15 = bVar2;
        pbVar15 = pbVar15 + 1;
      }
    }
  }
  if (pbVar23 < pbVar22) {
LAB_00229449:
    FVar9 = 0x14;
  }
  else {
    pFVar16 = (((FT_GlyphLoader)tmp)->current).outline.points;
    pFVar17 = pFVar16 + uVar12;
    pbVar18 = (byte *)(((FT_GlyphLoader)tmp)->current).outline.tags;
    lVar21 = 0;
    for (; pFVar16 < pFVar17; pFVar16 = pFVar16 + 1) {
      bVar2 = *pbVar18;
      if ((bVar2 & 2) == 0) {
        if ((bVar2 & 0x10) == 0) {
          if (pbVar23 < pbVar22 + 2) goto LAB_00229449;
          uVar14 = (long)(short)((ushort)*pbVar22 << 8) | (ulong)pbVar22[1];
          pbVar22 = pbVar22 + 2;
        }
        else {
          uVar14 = 0;
        }
      }
      else {
        pbVar1 = pbVar22 + 1;
        if (pbVar23 < pbVar1) goto LAB_00229449;
        bVar3 = *pbVar22;
        uVar14 = -(ulong)bVar3;
        pbVar22 = pbVar1;
        if ((bVar2 & 0x10) != 0) {
          uVar14 = (ulong)bVar3;
        }
      }
      lVar21 = lVar21 + uVar14;
      pFVar16->x = lVar21;
      *pbVar18 = bVar2 & 0xed;
      pbVar18 = pbVar18 + 1;
    }
    pFVar17 = (((FT_GlyphLoader)tmp)->current).outline.points;
    pbVar18 = (byte *)(((FT_GlyphLoader)tmp)->current).outline.tags;
    pFVar16 = pFVar17 + uVar12;
    lVar21 = 0;
    for (; pFVar17 < pFVar16; pFVar17 = pFVar17 + 1) {
      bVar2 = *pbVar18;
      if ((bVar2 & 4) == 0) {
        if ((bVar2 & 0x20) == 0) {
          if (pbVar23 < pbVar22 + 2) goto LAB_00229449;
          uVar14 = (long)(short)((ushort)*pbVar22 << 8) | (ulong)pbVar22[1];
          pbVar22 = pbVar22 + 2;
        }
        else {
          uVar14 = 0;
        }
      }
      else {
        pbVar1 = pbVar22 + 1;
        if (pbVar23 < pbVar1) goto LAB_00229449;
        bVar3 = *pbVar22;
        uVar14 = -(ulong)bVar3;
        pbVar22 = pbVar1;
        if ((bVar2 & 0x20) != 0) {
          uVar14 = (ulong)bVar3;
        }
      }
      lVar21 = lVar21 + uVar14;
      pFVar17->y = lVar21;
      *pbVar18 = bVar2 & 1;
      pbVar18 = pbVar18 + 1;
    }
    (((FT_GlyphLoader)tmp)->current).outline.n_points = (short)local_40;
    (((FT_GlyphLoader)tmp)->current).outline.n_contours = sVar4;
    load->cursor = pbVar22;
    FVar9 = 0;
  }
  return FVar9;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Load_Simple_Glyph( TT_Loader  load )
  {
    FT_Error        error;
    FT_Byte*        p          = load->cursor;
    FT_Byte*        limit      = load->limit;
    FT_GlyphLoader  gloader    = load->gloader;
    FT_Int          n_contours = load->n_contours;
    FT_Outline*     outline;
    FT_UShort       n_ins;
    FT_Int          n_points;

    FT_Byte         *flag, *flag_limit;
    FT_Byte         c, count;
    FT_Vector       *vec, *vec_limit;
    FT_Pos          x;
    FT_Short        *cont, *cont_limit, prev_cont;
    FT_Int          xy_size = 0;


    /* check that we can add the contours to the glyph */
    error = FT_GLYPHLOADER_CHECK_POINTS( gloader, 0, n_contours );
    if ( error )
      goto Fail;

    /* reading the contours' endpoints & number of points */
    cont       = gloader->current.outline.contours;
    cont_limit = cont + n_contours;

    /* check space for contours array + instructions count */
    if ( n_contours >= 0xFFF || p + ( n_contours + 1 ) * 2 > limit )
      goto Invalid_Outline;

    prev_cont = FT_NEXT_SHORT( p );

    if ( n_contours > 0 )
      cont[0] = prev_cont;

    if ( prev_cont < 0 )
      goto Invalid_Outline;

    for ( cont++; cont < cont_limit; cont++ )
    {
      cont[0] = FT_NEXT_SHORT( p );
      if ( cont[0] <= prev_cont )
      {
        /* unordered contours: this is invalid */
        goto Invalid_Outline;
      }
      prev_cont = cont[0];
    }

    n_points = 0;
    if ( n_contours > 0 )
    {
      n_points = cont[-1] + 1;
      if ( n_points < 0 )
        goto Invalid_Outline;
    }

    /* note that we will add four phantom points later */
    error = FT_GLYPHLOADER_CHECK_POINTS( gloader, n_points + 4, 0 );
    if ( error )
      goto Fail;

    /* reading the bytecode instructions */
    load->glyph->control_len  = 0;
    load->glyph->control_data = NULL;

    if ( p + 2 > limit )
      goto Invalid_Outline;

    n_ins = FT_NEXT_USHORT( p );

    FT_TRACE5(( "  Instructions size: %u\n", n_ins ));

#ifdef TT_USE_BYTECODE_INTERPRETER

    if ( IS_HINTED( load->load_flags ) )
    {
      FT_ULong  tmp;


      /* check instructions size */
      if ( ( limit - p ) < n_ins )
      {
        FT_TRACE1(( "TT_Load_Simple_Glyph: instruction count mismatch\n" ));
        error = FT_THROW( Too_Many_Hints );
        goto Fail;
      }

      /* we don't trust `maxSizeOfInstructions' in the `maxp' table */
      /* and thus update the bytecode array size by ourselves       */

      tmp   = load->exec->glyphSize;
      error = Update_Max( load->exec->memory,
                          &tmp,
                          sizeof ( FT_Byte ),
                          (void*)&load->exec->glyphIns,
                          n_ins );

      load->exec->glyphSize = (FT_UShort)tmp;
      if ( error )
        return error;

      load->glyph->control_len  = n_ins;
      load->glyph->control_data = load->exec->glyphIns;

      if ( n_ins )
        FT_MEM_COPY( load->exec->glyphIns, p, (FT_Long)n_ins );
    }

#endif /* TT_USE_BYTECODE_INTERPRETER */

    p += n_ins;

    outline = &gloader->current.outline;

    /* reading the point tags */
    flag       = (FT_Byte*)outline->tags;
    flag_limit = flag + n_points;

    FT_ASSERT( flag );

    while ( flag < flag_limit )
    {
      if ( p + 1 > limit )
        goto Invalid_Outline;

      *flag++ = c = FT_NEXT_BYTE( p );
      if ( c & 8 )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        count = FT_NEXT_BYTE( p );
        if ( flag + (FT_Int)count > flag_limit )
          goto Invalid_Outline;

        for ( ; count > 0; count-- )
          *flag++ = c;
      }
    }

    /* reading the X coordinates */

    vec       = outline->points;
    vec_limit = vec + n_points;
    flag      = (FT_Byte*)outline->tags;
    x         = 0;

    if ( p + xy_size > limit )
      goto Invalid_Outline;

    for ( ; vec < vec_limit; vec++, flag++ )
    {
      FT_Pos   y = 0;
      FT_Byte  f = *flag;


      if ( f & 2 )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        y = (FT_Pos)FT_NEXT_BYTE( p );
        if ( ( f & 16 ) == 0 )
          y = -y;
      }
      else if ( ( f & 16 ) == 0 )
      {
        if ( p + 2 > limit )
          goto Invalid_Outline;

        y = (FT_Pos)FT_NEXT_SHORT( p );
      }

      x     += y;
      vec->x = x;
      /* the cast is for stupid compilers */
      *flag  = (FT_Byte)( f & ~( 2 | 16 ) );
    }

    /* reading the Y coordinates */

    vec       = gloader->current.outline.points;
    vec_limit = vec + n_points;
    flag      = (FT_Byte*)outline->tags;
    x         = 0;

    for ( ; vec < vec_limit; vec++, flag++ )
    {
      FT_Pos   y = 0;
      FT_Byte  f = *flag;


      if ( f & 4 )
      {
        if ( p + 1 > limit )
          goto Invalid_Outline;

        y = (FT_Pos)FT_NEXT_BYTE( p );
        if ( ( f & 32 ) == 0 )
          y = -y;
      }
      else if ( ( f & 32 ) == 0 )
      {
        if ( p + 2 > limit )
          goto Invalid_Outline;

        y = (FT_Pos)FT_NEXT_SHORT( p );
      }

      x     += y;
      vec->y = x;
      /* the cast is for stupid compilers */
      *flag  = (FT_Byte)( f & FT_CURVE_TAG_ON );
    }

    outline->n_points   = (FT_Short)n_points;
    outline->n_contours = (FT_Short)n_contours;

    load->cursor = p;

  Fail:
    return error;

  Invalid_Outline:
    error = FT_THROW( Invalid_Outline );
    goto Fail;
  }